

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

const_iterator __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::lower_bound(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
              *this,QAbstractButton **key)

{
  void *pvVar1;
  QAbstractButton **ppQVar2;
  const_iterator cVar3;
  
  pvVar1 = (this->c).keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.ptr;
  ppQVar2 = std::
            __lower_bound<QAbstractButton*const*,QAbstractButton*,__gnu_cxx::__ops::_Iter_comp_val<std::less<QAbstractButton*>>>
                      (pvVar1,(void *)((long)pvVar1 +
                                      (this->c).keys.super_QVLABase<QAbstractButton_*>.
                                      super_QVLABaseBase.s * 8),key);
  cVar3.i = (long)ppQVar2 -
            (long)(this->c).keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.ptr >> 3;
  cVar3.c = &this->c;
  return cVar3;
}

Assistant:

const_iterator lower_bound(const Key &key) const
    {
        return fromKeysIterator(std::lower_bound(c.keys.begin(), c.keys.end(), key, key_comp()));
    }